

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

DTD * dtdCreate(XML_Memory_Handling_Suite *ms)

{
  DTD *p_00;
  DTD *p;
  XML_Memory_Handling_Suite *ms_local;
  
  p_00 = (DTD *)(*ms->malloc_fcn)(0x140);
  if (p_00 != (DTD *)0x0) {
    poolInit(&p_00->pool,ms);
    poolInit(&p_00->entityValuePool,ms);
    hashTableInit((HASH_TABLE *)p_00,ms);
    hashTableInit(&p_00->elementTypes,ms);
    hashTableInit(&p_00->attributeIds,ms);
    hashTableInit(&p_00->prefixes,ms);
    (p_00->defaultPrefix).name = (XML_Char *)0x0;
    (p_00->defaultPrefix).binding = (BINDING *)0x0;
    p_00->in_eldecl = '\0';
    p_00->scaffIndex = (int *)0x0;
    p_00->scaffold = (CONTENT_SCAFFOLD *)0x0;
    p_00->scaffLevel = 0;
    p_00->scaffSize = 0;
    p_00->scaffCount = 0;
    p_00->contentStringLen = 0;
    p_00->keepProcessing = '\x01';
    p_00->hasParamEntityRefs = '\0';
    p_00->standalone = '\0';
  }
  return p_00;
}

Assistant:

static DTD *
dtdCreate(const XML_Memory_Handling_Suite *ms) {
  DTD *p = ms->malloc_fcn(sizeof(DTD));
  if (p == NULL)
    return p;
  poolInit(&(p->pool), ms);
  poolInit(&(p->entityValuePool), ms);
  hashTableInit(&(p->generalEntities), ms);
  hashTableInit(&(p->elementTypes), ms);
  hashTableInit(&(p->attributeIds), ms);
  hashTableInit(&(p->prefixes), ms);
#ifdef XML_DTD
  p->paramEntityRead = XML_FALSE;
  hashTableInit(&(p->paramEntities), ms);
#endif /* XML_DTD */
  p->defaultPrefix.name = NULL;
  p->defaultPrefix.binding = NULL;

  p->in_eldecl = XML_FALSE;
  p->scaffIndex = NULL;
  p->scaffold = NULL;
  p->scaffLevel = 0;
  p->scaffSize = 0;
  p->scaffCount = 0;
  p->contentStringLen = 0;

  p->keepProcessing = XML_TRUE;
  p->hasParamEntityRefs = XML_FALSE;
  p->standalone = XML_FALSE;
  return p;
}